

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_avx2.c
# Opt level: O0

void uavs3d_if_ver_chroma_w8_avx2
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong *puVar16;
  undefined8 *puVar17;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  undefined1 auVar18 [16];
  ushort *in_stack_00000008;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m256i S3;
  __m256i S2;
  __m256i S1;
  __m256i S0;
  __m256i mVal;
  __m256i T1;
  __m256i T0;
  __m256i coeff1;
  __m256i coeff0;
  int i_src4;
  int i_src3;
  int i_src2;
  __m256i mAddOffset;
  int shift;
  int offset;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined1 auStack_550 [16];
  int local_46c;
  undefined8 *local_460;
  ulong *local_450;
  undefined1 local_2c0 [16];
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar5 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar5 = vpinsrw_avx(auVar5,0x20,2);
  auVar5 = vpinsrw_avx(auVar5,0x20,3);
  auVar5 = vpinsrw_avx(auVar5,0x20,4);
  auVar5 = vpinsrw_avx(auVar5,0x20,5);
  auVar5 = vpinsrw_avx(auVar5,0x20,6);
  auVar5 = vpinsrw_avx(auVar5,0x20,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar6 = vpinsrw_avx(auVar6,0x20,2);
  auVar6 = vpinsrw_avx(auVar6,0x20,3);
  auVar6 = vpinsrw_avx(auVar6,0x20,4);
  auVar6 = vpinsrw_avx(auVar6,0x20,5);
  auVar6 = vpinsrw_avx(auVar6,0x20,6);
  auVar6 = vpinsrw_avx(auVar6,0x20,7);
  uStack_f0 = auVar6._0_8_;
  uStack_e8 = auVar6._8_8_;
  uVar4 = *in_stack_00000008;
  auVar6 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,2);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,3);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,4);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,5);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,6);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,7);
  auVar7 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,2);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,3);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,4);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,5);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,6);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,7);
  uStack_b0 = auVar7._0_8_;
  uStack_a8 = auVar7._8_8_;
  uVar4 = in_stack_00000008[1];
  auVar7 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,2);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,3);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,4);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,5);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,6);
  auVar7 = vpinsrw_avx(auVar7,(uint)uVar4,7);
  auVar8 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,2);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,3);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,4);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,5);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,6);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,7);
  auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
  uStack_70 = auVar18._0_8_;
  uStack_68 = auVar18._8_8_;
  local_450 = (ulong *)(in_RDI - in_ESI);
  local_46c = in_R9D;
  local_460 = in_RDX;
  while (local_46c != 0) {
    uVar1 = *local_450;
    puVar16 = (ulong *)((long)local_450 + (long)in_ESI);
    uVar2 = *(ulong *)((long)local_450 + (long)(in_ESI * 2));
    uVar3 = *(ulong *)((long)local_450 + (long)(in_ESI * 3));
    puVar17 = (undefined8 *)((long)local_450 + (long)(in_ESI << 2));
    local_450 = (ulong *)((long)local_450 + (long)(in_ESI * 2));
    local_46c = local_46c + -2;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15._16_8_ = *puVar16;
    auVar15._24_8_ = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *puVar16;
    auVar9._16_8_ = uVar2;
    auVar9._24_8_ = 0;
    auVar9 = vpunpcklbw_avx2(auVar15,auVar9);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar2;
    auVar14._16_8_ = uVar3;
    auVar14._24_8_ = 0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar3;
    auVar13._16_8_ = *puVar17;
    auVar13._24_8_ = 0;
    auVar10 = vpunpcklbw_avx2(auVar14,auVar13);
    auVar12._16_8_ = uStack_b0;
    auVar12._0_16_ = auVar6;
    auVar12._24_8_ = uStack_a8;
    auVar9 = vpmaddubsw_avx2(auVar9,auVar12);
    auVar11._16_8_ = uStack_70;
    auVar11._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar8;
    auVar11._24_8_ = uStack_68;
    auVar10 = vpmaddubsw_avx2(auVar10,auVar11);
    auVar9 = vpaddw_avx2(auVar9,auVar10);
    auVar10._16_8_ = uStack_f0;
    auVar10._0_16_ = auVar5;
    auVar10._24_8_ = uStack_e8;
    auVar9 = vpaddw_avx2(auVar9,auVar10);
    auVar9 = vpsraw_avx2(auVar9,ZEXT416(6));
    auStack_550 = auVar9._16_16_;
    auVar18 = vpackuswb_avx(auStack_550,local_2c0);
    local_5f0 = auVar18._0_8_;
    uStack_5e8 = auVar18._8_8_;
    *local_460 = local_5f0;
    *(undefined8 *)((long)local_460 + (long)in_ECX) = uStack_5e8;
    local_460 = (undefined8 *)((long)local_460 + (long)(in_ECX << 1));
  }
  return;
}

Assistant:

void uavs3d_if_ver_chroma_w8_avx2(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff, int max_val)
{
    const int offset = 32;
    const int shift = 6;
    __m256i mAddOffset = _mm256_set1_epi16(offset);
    const int i_src2 = i_src * 2;
    const int i_src3 = i_src * 3;
    const int i_src4 = i_src * 4;
    __m256i coeff0 = _mm256_set1_epi16(*(s16*)coeff);
    __m256i coeff1 = _mm256_set1_epi16(*(s16*)(coeff + 2));
    __m256i T0, T1, mVal;
    __m256i S0, S1, S2, S3;
    __m128i s0, s1, s2, s3, s4;

    src -= i_src;

    while (height) {
        s0 = _mm_loadl_epi64((__m128i*)(src));
        s1 = _mm_loadl_epi64((__m128i*)(src + i_src));
        s2 = _mm_loadl_epi64((__m128i*)(src + i_src2));
        s3 = _mm_loadl_epi64((__m128i*)(src + i_src3));
        s4 = _mm_loadl_epi64((__m128i*)(src + i_src4));

        src += 2 * i_src;
        height -= 2;
        uavs3d_prefetch(src + i_src3, _MM_HINT_NTA);
        uavs3d_prefetch(src + i_src4, _MM_HINT_NTA);

        S0 = _mm256_set_m128i(s1, s0);
        S1 = _mm256_set_m128i(s2, s1);
        S2 = _mm256_set_m128i(s3, s2);
        S3 = _mm256_set_m128i(s4, s3);

        S0 = _mm256_unpacklo_epi8(S0, S1);
        S2 = _mm256_unpacklo_epi8(S2, S3);

        T0 = _mm256_maddubs_epi16(S0, coeff0);
        T1 = _mm256_maddubs_epi16(S2, coeff1);

        mVal = _mm256_add_epi16(T0, T1);

        mVal = _mm256_add_epi16(mVal, mAddOffset);
        mVal = _mm256_srai_epi16(mVal, shift);
        s0 = _mm_packus_epi16(_mm256_castsi256_si128(mVal), _mm256_extracti128_si256(mVal, 1));

        _mm_storel_epi64((__m128i*)(dst), s0);
        _mm_storeh_pi((__m64*)(dst + i_dst), _mm_castsi128_ps(s0));

        dst += 2 * i_dst;
    }
}